

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O0

bool helics::changeDetected(defV *prevValue,double *vals,size_t size,double deltaV)

{
  char *pcVar1;
  vector<double,_std::allocator<double>_> *this;
  size_type sVar2;
  int in_EDX;
  undefined4 in_register_00000014;
  char *in_RSI;
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  *in_RDI;
  vector<double,_std::allocator<double>_> *pvVar3;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  size_t ii;
  vector<double,_std::allocator<double>_> *prevV;
  ulong local_38;
  
  pcVar1 = std::
           variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
           ::index(in_RDI,in_RSI,in_EDX);
  if (pcVar1 == (char *)0x4) {
    this = std::
           get<std::vector<double,std::allocator<double>>,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                     ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                       *)0x424657);
    sVar2 = std::vector<double,_std::allocator<double>_>::size(this);
    if (CONCAT44(in_register_00000014,in_EDX) == sVar2) {
      local_38 = 0;
      while( true ) {
        if (CONCAT44(in_register_00000014,in_EDX) <= local_38) {
          return false;
        }
        pvVar3 = this;
        std::vector<double,_std::allocator<double>_>::operator[](this,local_38);
        std::abs((int)pvVar3);
        if (in_XMM0_Qa < extraout_XMM0_Qa) break;
        local_38 = local_38 + 1;
      }
      return true;
    }
  }
  return true;
}

Assistant:

bool changeDetected(const defV& prevValue, const double* vals, size_t size, double deltaV)
{
    if (prevValue.index() == vector_loc) {
        const auto& prevV = std::get<std::vector<double>>(prevValue);
        if (size == prevV.size()) {
            for (size_t ii = 0; ii < size; ++ii) {
                if (std::abs(prevV[ii] - vals[ii]) > deltaV) {
                    return true;
                }
            }
            return false;
        }
    }
    return true;
}